

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

Real __thiscall amrex::FluxRegister::SumReg(FluxRegister *this,int comp)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Box hibx;
  Array4<const_double> *hifab;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box lobx;
  Array4<const_double> *lofab;
  FabSetIter fsi;
  FabSet *hifabs;
  FabSet *lofabs;
  int dir;
  Real sum;
  MFIter *in_stack_fffffffffffffc38;
  Box *in_stack_fffffffffffffc40;
  int local_38c;
  int local_388;
  int local_384;
  Box local_344;
  MFIter local_328;
  int local_294;
  int local_290;
  int iStack_28c;
  int iStack_288;
  int local_284;
  int iStack_280;
  long local_278 [8];
  long *local_238;
  MFIter local_230;
  Orientation local_1cc;
  long local_1c8;
  Orientation local_1bc;
  long local_1b8;
  int local_1ac;
  double local_1a8;
  int local_19c;
  undefined8 local_190;
  int local_188;
  Box *local_180;
  int local_174;
  int iStack_170;
  int local_16c;
  int *local_158;
  undefined8 local_140;
  int local_138;
  Box *local_130;
  int local_124;
  int iStack_120;
  int local_11c;
  int *local_108;
  int local_ec;
  int local_e8;
  int local_e4;
  MFIter *local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_1a8 = 0.0;
  local_19c = in_ESI;
  for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
    Orientation::Orientation(&local_1bc,local_1ac,low);
    iVar2 = Orientation::operator_cast_to_int(&local_1bc);
    local_1b8 = in_RDI + 8 + (long)iVar2 * 0x180;
    Orientation::Orientation(&local_1cc,local_1ac,high);
    iVar2 = Orientation::operator_cast_to_int(&local_1cc);
    local_1c8 = in_RDI + 8 + (long)iVar2 * 0x180;
    FabSetIter::FabSetIter
              ((FabSetIter *)in_stack_fffffffffffffc40,(FabSet *)in_stack_fffffffffffffc38);
    while (bVar1 = MFIter::isValid(&local_230), bVar1) {
      FabSet::const_array((FabSet *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_238 = local_278;
      Box::Box<double_const>
                (in_stack_fffffffffffffc40,(Array4<const_double> *)in_stack_fffffffffffffc38);
      local_3c = 0;
      local_4c = 1;
      local_5c = 2;
      local_98 = &iStack_288;
      local_9c = 0;
      local_a8 = &iStack_288;
      local_ac = 1;
      local_b8 = &iStack_288;
      local_bc = 2;
      for (local_328.local_tile_index_map._4_4_ = iStack_28c; iVar2 = local_290,
          local_328.local_tile_index_map._4_4_ <= iStack_280;
          local_328.local_tile_index_map._4_4_ = local_328.local_tile_index_map._4_4_ + 1) {
        while (local_328.local_tile_index_map._0_4_ = iVar2, iVar2 = local_294,
              (int)local_328.local_tile_index_map <= local_284) {
          while (local_328.tile_array._4_4_ = iVar2, local_328.tile_array._4_4_ <= iStack_288) {
            local_c8 = local_238;
            local_cc = local_328.tile_array._4_4_;
            local_d0 = (int)local_328.local_tile_index_map;
            local_d4 = local_328.local_tile_index_map._4_4_;
            local_1a8 = *(double *)
                         (*local_238 +
                         ((long)(local_328.tile_array._4_4_ - (int)local_238[4]) +
                          (long)((int)local_328.local_tile_index_map -
                                *(int *)((long)local_238 + 0x24)) * local_238[1] +
                          (long)(local_328.local_tile_index_map._4_4_ - (int)local_238[5]) *
                          local_238[2] + (long)local_19c * local_238[3]) * 8) + local_1a8;
            iVar2 = local_328.tile_array._4_4_ + 1;
          }
          iVar2 = (int)local_328.local_tile_index_map + 1;
        }
      }
      in_stack_fffffffffffffc38 = &local_328;
      local_158 = &local_294;
      local_108 = &local_294;
      local_58 = &local_294;
      local_48 = &local_294;
      local_38 = &local_294;
      FabSet::const_array((FabSet *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      in_stack_fffffffffffffc40 = &local_344;
      local_328.local_index_map = (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc38;
      Box::Box<double_const>
                (in_stack_fffffffffffffc40,(Array4<const_double> *)in_stack_fffffffffffffc38);
      local_c = 0;
      local_174 = (in_stack_fffffffffffffc40->smallend).vect[0];
      local_1c = 1;
      iStack_170 = (in_stack_fffffffffffffc40->smallend).vect[1];
      local_190 = *(undefined8 *)(in_stack_fffffffffffffc40->smallend).vect;
      local_2c = 2;
      local_188 = (in_stack_fffffffffffffc40->smallend).vect[2];
      local_68 = &in_stack_fffffffffffffc40->bigend;
      local_6c = 0;
      local_124 = local_68->vect[0];
      local_78 = &in_stack_fffffffffffffc40->bigend;
      local_7c = 1;
      iStack_120 = (in_stack_fffffffffffffc40->bigend).vect[1];
      local_140 = *(undefined8 *)local_68->vect;
      local_88 = &in_stack_fffffffffffffc40->bigend;
      local_8c = 2;
      local_138 = (in_stack_fffffffffffffc40->bigend).vect[2];
      for (local_384 = local_188; local_388 = iStack_170, local_384 <= local_138;
          local_384 = local_384 + 1) {
        for (; local_38c = local_174, local_388 <= iStack_120; local_388 = local_388 + 1) {
          for (; local_38c <= local_124; local_38c = local_38c + 1) {
            local_e0 = (MFIter *)local_328.local_index_map;
            local_e4 = local_38c;
            local_e8 = local_388;
            local_ec = local_384;
            local_1a8 = local_1a8 -
                        *(double *)
                         ((long)&((((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                     *)&(local_328.local_index_map)->
                                        super_vector<int,_std::allocator<int>_>)->_M_t).
                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)
                                 ->_vptr_FabArrayBase +
                         ((long)(local_38c - *(int *)((long)local_328.local_index_map + 0x20)) +
                          (long)(local_388 - *(int *)((long)local_328.local_index_map + 0x24)) *
                          (long)*(FabArrayBase **)((long)local_328.local_index_map + 8) +
                          (long)(local_384 - *(int *)((long)local_328.local_index_map + 0x28)) *
                          *(long *)((IntVect *)((long)local_328.local_index_map + 0x10))->vect +
                         (long)local_19c *
                         *(long *)(((IntVect *)((long)local_328.local_index_map + 0x10))->vect + 2))
                         * 8);
          }
        }
      }
      local_180 = in_stack_fffffffffffffc40;
      local_16c = local_188;
      local_130 = in_stack_fffffffffffffc40;
      local_11c = local_138;
      local_28 = in_stack_fffffffffffffc40;
      local_18 = in_stack_fffffffffffffc40;
      local_8 = in_stack_fffffffffffffc40;
      MFIter::operator++(&local_230);
    }
    FabSetIter::~FabSetIter((FabSetIter *)0x12fc8c8);
  }
  ParallelDescriptor::ReduceRealSum<double>(&local_1a8);
  return local_1a8;
}

Assistant:

Real
FluxRegister::SumReg (int comp) const
{
    Real sum = 0.0;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
    {
        const FabSet& lofabs = bndry[Orientation(dir,Orientation::low) ];
        const FabSet& hifabs = bndry[Orientation(dir,Orientation::high)];

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            sum += amrex::ReduceSum(lofabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& lofab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r += lofab(i,j,k,comp);
                       });
                       return r;
                   });
            sum += amrex::ReduceSum(hifabs.m_mf, 0,
                   [=] AMREX_GPU_HOST_DEVICE (Box const& tbx,
                                              Array4<Real const> const& hifab) -> Real
                   {
                       Real r = 0.0;
                       AMREX_LOOP_3D(tbx, i, j, k,
                       {
                           r -= hifab(i,j,k,comp);
                       });
                       return r;
                   });
        }
        else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(+:sum)
#endif
            for (FabSetIter fsi(lofabs); fsi.isValid(); ++fsi)
            {
                Array4<Real const> const& lofab = lofabs.const_array(fsi);
                Box lobx(lofab);
                AMREX_LOOP_3D(lobx, i, j, k,
                {
                    sum += lofab(i,j,k,comp);
                });
                Array4<Real const> const& hifab = hifabs.const_array(fsi);
                Box hibx(hifab);
                AMREX_LOOP_3D(hibx, i, j, k,
                {
                    sum -= hifab(i,j,k,comp);
                });
            }
        }
    }

    ParallelDescriptor::ReduceRealSum(sum);

    return sum;
}